

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O0

bool __thiscall ON_EmbeddedFile::Write(ON_EmbeddedFile *this,ON_BinaryArchive *archive)

{
  CImpl *pCVar1;
  size_t sizeof__inbuffer;
  bool bVar2;
  pointer inbuffer;
  Data *d;
  ON_BinaryArchive *archive_local;
  ON_EmbeddedFile *this_local;
  
  pCVar1 = this->m_impl;
  if (((pCVar1->m_data).m_error & 1U) == 0) {
    bVar2 = ON_BinaryArchive::WriteString(archive,&this->m_impl->m_orig_file);
    if (bVar2) {
      sizeof__inbuffer = (pCVar1->m_data).m_length;
      inbuffer = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                           (&(pCVar1->m_data).m_buffer);
      bVar2 = ON_BinaryArchive::WriteCompressedBuffer(archive,sizeof__inbuffer,inbuffer);
      if (bVar2) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_EmbeddedFile::Write(ON_BinaryArchive& archive) const
{
  auto& d = m_impl->m_data;
  if (d.m_error)
    return false; // Can't write when in error state.

  // Write the original filename to the archive.
  if (!archive.WriteString(m_impl->m_orig_file))
    return false;

  // Write the temp file data to the archive.
  if (!archive.WriteCompressedBuffer(d.m_length, d.m_buffer.get()))
    return false;

  return true;
}